

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void mbedtls_ssl_update_out_pointers(mbedtls_ssl_context *ssl,mbedtls_ssl_transform *transform)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  
  puVar1 = ssl->out_hdr;
  puVar2 = puVar1 + 3;
  lVar3 = 5;
  if (ssl->conf->transport == '\x01') {
    ssl->out_ctr = puVar2;
    puVar2 = puVar1 + 0xb;
    lVar3 = 0xd;
  }
  puVar1 = puVar1 + lVar3;
  ssl->out_len = puVar2;
  ssl->out_iv = puVar1;
  ssl->out_msg = puVar1;
  if (transform != (mbedtls_ssl_transform *)0x0) {
    ssl->out_msg = puVar1 + (transform->ivlen - transform->fixed_ivlen);
  }
  return;
}

Assistant:

void mbedtls_ssl_update_out_pointers(mbedtls_ssl_context *ssl,
                                     mbedtls_ssl_transform *transform)
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        ssl->out_ctr = ssl->out_hdr +  3;
#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
        ssl->out_cid = ssl->out_ctr + MBEDTLS_SSL_SEQUENCE_NUMBER_LEN;
        ssl->out_len = ssl->out_cid;
        if (transform != NULL) {
            ssl->out_len += transform->out_cid_len;
        }
#else /* MBEDTLS_SSL_DTLS_CONNECTION_ID */
        ssl->out_len = ssl->out_ctr + MBEDTLS_SSL_SEQUENCE_NUMBER_LEN;
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */
        ssl->out_iv  = ssl->out_len + 2;
    } else
#endif
    {
        ssl->out_len = ssl->out_hdr + 3;
#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
        ssl->out_cid = ssl->out_len;
#endif
        ssl->out_iv  = ssl->out_hdr + 5;
    }

    ssl->out_msg = ssl->out_iv;
    /* Adjust out_msg to make space for explicit IV, if used. */
    if (transform != NULL) {
        ssl->out_msg += ssl_transform_get_explicit_iv_len(transform);
    }
}